

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

UINT8 k053260_read(void *chip,UINT8 offset)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  
  uVar4 = offset & 0x3f;
  if ((byte)uVar4 < 2) {
    bVar3 = *(byte *)((long)chip + (ulong)uVar4 + 0x20);
  }
  else if (uVar4 == 0x2e) {
    if ((*(byte *)((long)chip + 0x25) & 1) == 0) {
      bVar3 = 0;
      emu_logf((DEV_LOGGER *)((long)chip + 8),'\x02',"Attempting to read ROM without mode bit set\n"
              );
    }
    else {
      iVar1 = *(int *)((long)chip + 0x30);
      *(uint *)((long)chip + 0x30) = iVar1 + 1U & 0xffff;
      bVar3 = *(byte *)(*(long *)(*(long *)((long)chip + 0x28) + 200) +
                       (ulong)(*(int *)((long)chip + 0x40) + iVar1 &
                              *(uint *)(*(long *)((long)chip + 0x28) + 0xd4)));
    }
  }
  else if (uVar4 == 0x29) {
    pcVar5 = (char *)((long)chip + 0x3f);
    bVar3 = 0;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      bVar3 = bVar3 | *pcVar5 << ((byte)lVar2 & 0x1f);
      pcVar5 = pcVar5 + 0x28;
    }
  }
  else {
    bVar3 = 0;
    emu_logf((DEV_LOGGER *)((long)chip + 8),'\x04',"Read from unknown register %02x\n",(ulong)uVar4)
    ;
  }
  return bVar3;
}

Assistant:

static UINT8 k053260_read(void* chip, UINT8 offset)
{
	k053260_state *info = (k053260_state *)chip;
	UINT8 ret;
	int i;

	offset &= 0x3f;
	ret = 0;

	switch (offset)
	{
		case 0x00: // main-to-sub ports
		case 0x01:
			ret = info->portdata[offset];
			break;

		case 0x29: // voice status
			for (i = 0; i < 4; i++)
				ret |= info->voice[i].playing << i;
			break;

		case 0x2e: // read ROM
			if (info->mode & 1)
				ret = KDSC_read_rom(&info->voice[0]);
			else
				emu_logf(&info->logger, DEVLOG_WARN, "Attempting to read ROM without mode bit set\n");
			break;

		default:
			emu_logf(&info->logger, DEVLOG_DEBUG, "Read from unknown register %02x\n", offset);
	}
	return ret;
}